

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

LY_ERR lyd_diff(lyd_node *first,lyd_node *second,uint16_t options,ly_bool nosiblings,lyd_node **diff
               )

{
  lysc_node *plVar1;
  lysc_node *plVar2;
  lysc_node *local_60;
  lysc_node *local_50;
  ly_ctx *local_48;
  ly_ctx *local_40;
  ly_ctx *local_38;
  ly_ctx *ctx;
  lyd_node **diff_local;
  ly_bool nosiblings_local;
  uint16_t options_local;
  lyd_node *second_local;
  lyd_node *first_local;
  
  if (diff == (lyd_node **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","diff","lyd_diff");
    first_local._4_4_ = LY_EINVAL;
  }
  else {
    if (first == (lyd_node *)0x0) {
      if (second == (lyd_node *)0x0) {
        local_38 = (ly_ctx *)0x0;
      }
      else {
        if (second->schema == (lysc_node *)0x0) {
          local_48 = (ly_ctx *)second[2].schema;
        }
        else {
          local_48 = second->schema->module->ctx;
        }
        local_38 = local_48;
      }
    }
    else {
      if (first->schema == (lysc_node *)0x0) {
        local_40 = (ly_ctx *)first[2].schema;
      }
      else {
        local_40 = first->schema->module->ctx;
      }
      local_38 = local_40;
    }
    if ((first != (lyd_node *)0x0) && (second != (lyd_node *)0x0)) {
      if (first->schema == (lysc_node *)0x0) {
        local_50 = (lysc_node *)0x0;
      }
      else {
        local_50 = first->schema->parent;
      }
      plVar1 = lysc_data_node(local_50);
      if (second->schema == (lysc_node *)0x0) {
        local_60 = (lysc_node *)0x0;
      }
      else {
        local_60 = second->schema->parent;
      }
      plVar2 = lysc_data_node(local_60);
      if (plVar1 != plVar2) {
        ly_log(local_38,LY_LLERR,LY_EINVAL,
               "Invalid arguments - cannot create diff for unrelated data (%s()).","lyd_diff");
        return LY_EINVAL;
      }
    }
    *diff = (lyd_node *)0x0;
    first_local._4_4_ = lyd_diff_siblings_r(first,second,options,nosiblings,diff);
  }
  return first_local._4_4_;
}

Assistant:

static LY_ERR
lyd_diff(const struct lyd_node *first, const struct lyd_node *second, uint16_t options, ly_bool nosiblings,
        struct lyd_node **diff)
{
    const struct ly_ctx *ctx;

    LY_CHECK_ARG_RET(NULL, diff, LY_EINVAL);

    if (first) {
        ctx = LYD_CTX(first);
    } else if (second) {
        ctx = LYD_CTX(second);
    } else {
        ctx = NULL;
    }

    if (first && second && (lysc_data_parent(first->schema) != lysc_data_parent(second->schema))) {
        LOGERR(ctx, LY_EINVAL, "Invalid arguments - cannot create diff for unrelated data (%s()).", __func__);
        return LY_EINVAL;
    }

    *diff = NULL;

    return lyd_diff_siblings_r(first, second, options, nosiblings, diff);
}